

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

void node_display(ACT_NODE_t *nod)

{
  uint uVar1;
  act_edge *paVar2;
  AC_PATTERN_t *pAVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined8 uVar6;
  ushort **ppuVar7;
  ulong uVar8;
  char *__format;
  long lVar9;
  
  printf("NODE(%3d)/....fail....> ",(ulong)(uint)nod->id);
  if (nod->failure_node == (act_node *)0x0) {
    puts("N.A.");
  }
  else {
    printf("NODE(%3d)\n",(ulong)(uint)nod->failure_node->id);
  }
  if (nod->outgoing_size != 0) {
    lVar9 = 8;
    uVar8 = 0;
    do {
      paVar2 = nod->outgoing;
      printf("         |----(");
      ppuVar7 = __ctype_b_loc();
      __format = "0x%x)";
      if ((short)(*ppuVar7)[*(char *)((long)paVar2 + lVar9 + -8)] < 0) {
        __format = "%c)---";
      }
      printf(__format);
      printf("--> NODE(%3d)\n",(ulong)**(uint **)(&paVar2->alpha + lVar9));
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x10;
    } while (uVar8 < nod->outgoing_size);
  }
  if (nod->matched_size != 0) {
    printf("Accepts: {");
    if (nod->matched_size != 0) {
      lVar9 = 0x28;
      uVar8 = 0;
      do {
        pAVar3 = nod->matched;
        uVar4 = *(undefined8 *)((long)pAVar3 + lVar9 + -0x28);
        uVar5 = *(ulong *)((long)pAVar3 + lVar9 + -0x20);
        uVar6 = *(undefined8 *)((long)pAVar3 + lVar9 + -8);
        uVar1 = *(uint *)((long)&(pAVar3->ptext).astring + lVar9);
        if (uVar8 != 0) {
          printf(", ");
        }
        if (uVar1 < 2) {
          printf("%ld",uVar6);
        }
        else if (uVar1 == 2) {
          printf("%s",uVar6);
        }
        printf(": %.*s",uVar5 & 0xffffffff,uVar4);
        uVar8 = uVar8 + 1;
        lVar9 = lVar9 + 0x30;
      } while (uVar8 < nod->matched_size);
    }
    puts("}");
  }
  putchar(10);
  return;
}

Assistant:

void node_display (ACT_NODE_t *nod)
{
    size_t j;
    struct act_edge *e;
    AC_PATTERN_t patt;
    
    printf("NODE(%3d)/....fail....> ", nod->id);
    if (nod->failure_node)
        printf("NODE(%3d)\n", nod->failure_node->id);
    else
        printf ("N.A.\n");
    
    for (j = 0; j < nod->outgoing_size; j++)
    {
        e = &nod->outgoing[j];
        printf("         |----(");
        if(isgraph(e->alpha))
            printf("%c)---", e->alpha);
        else
            printf("0x%x)", e->alpha);
        printf("--> NODE(%3d)\n", e->next->id);
    }

    if (nod->matched_size)
    {
        printf("Accepts: {");
        for (j = 0; j < nod->matched_size; j++)
        {
            patt = nod->matched[j];
            if(j) 
                printf(", ");
            switch (patt.id.type)
            {
            case AC_PATTID_TYPE_DEFAULT:
            case AC_PATTID_TYPE_NUMBER:
                printf("%ld", patt.id.u.number);
                break;
            case AC_PATTID_TYPE_STRING:
                printf("%s", patt.id.u.stringy);
                break;
            }
            printf(": %.*s", (int)patt.ptext.length, patt.ptext.astring);
        }
        printf("}\n");
    }
    printf("\n");
}